

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O2

ion_err_t oafh_destroy(ion_file_hashmap_t *hash_map)

{
  ion_err_t iVar1;
  int iVar2;
  char addr_filename [12];
  char local_14 [12];
  
  hash_map->compute_hash = (_func_int_ion_file_hashmap_t_ptr_ion_key_t_int *)0x0;
  hash_map->map_size = 0;
  (hash_map->super).record.key_size = 0;
  (hash_map->super).record.value_size = 0;
  iVar2 = dictionary_get_filename((hash_map->super).id,"oaf",local_14);
  iVar1 = '\x04';
  if ((iVar2 < 0xc) && ((FILE *)hash_map->file != (FILE *)0x0)) {
    fclose((FILE *)hash_map->file);
    remove(local_14);
    hash_map->file = (FILE *)0x0;
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
oafh_destroy(
	ion_file_hashmap_t *hash_map
) {
	hash_map->compute_hash				= NULL;
	hash_map->map_size					= 0;
	hash_map->super.record.key_size		= 0;
	hash_map->super.record.value_size	= 0;

	char addr_filename[ION_MAX_FILENAME_LENGTH];

	int actual_filename_length = dictionary_get_filename(hash_map->super.id, "oaf", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_dictionary_destruction_error;
	}

	if (hash_map->file != NULL) {
		/* check to ensure that you are not freeing something already free */
		fclose(hash_map->file);
		fremove(addr_filename);
		hash_map->file = NULL;
		return err_ok;
	}
	else {
		return err_dictionary_destruction_error;
	}
}